

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void InstructionSet::x86::Primitive::
     popa<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (Context *context)

{
  unsigned_short uVar1;
  uint16_t *puVar2;
  Context *context_local;
  
  PCCompatible::Memory::preauthorise_stack_read(&context->memory,0x10);
  uVar1 = pop<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                    (context);
  puVar2 = PCCompatible::Registers::di(&context->registers);
  *puVar2 = uVar1;
  uVar1 = pop<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                    (context);
  puVar2 = PCCompatible::Registers::si(&context->registers);
  *puVar2 = uVar1;
  uVar1 = pop<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                    (context);
  puVar2 = PCCompatible::Registers::bp(&context->registers);
  *puVar2 = uVar1;
  puVar2 = PCCompatible::Registers::sp(&context->registers);
  *puVar2 = *puVar2 + 2;
  uVar1 = pop<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                    (context);
  puVar2 = PCCompatible::Registers::bx(&context->registers);
  *puVar2 = uVar1;
  uVar1 = pop<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                    (context);
  puVar2 = PCCompatible::Registers::dx(&context->registers);
  *puVar2 = uVar1;
  uVar1 = pop<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                    (context);
  puVar2 = PCCompatible::Registers::cx(&context->registers);
  *puVar2 = uVar1;
  uVar1 = pop<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                    (context);
  puVar2 = PCCompatible::Registers::ax(&context->registers);
  *puVar2 = uVar1;
  return;
}

Assistant:

void popa(
	ContextT &context
) {
	context.memory.preauthorise_stack_read(sizeof(IntT) * 8);
	if constexpr (std::is_same_v<IntT, uint32_t>) {
		context.registers.edi() = pop<uint32_t, true>(context);
		context.registers.esi() = pop<uint32_t, true>(context);
		context.registers.ebp() = pop<uint32_t, true>(context);
		context.registers.esp() += 4;
		context.registers.ebx() = pop<uint32_t, true>(context);
		context.registers.edx() = pop<uint32_t, true>(context);
		context.registers.ecx() = pop<uint32_t, true>(context);
		context.registers.eax() = pop<uint32_t, true>(context);
	} else {
		context.registers.di() = pop<uint16_t, true>(context);
		context.registers.si() = pop<uint16_t, true>(context);
		context.registers.bp() = pop<uint16_t, true>(context);
		context.registers.sp() += 2;
		context.registers.bx() = pop<uint16_t, true>(context);
		context.registers.dx() = pop<uint16_t, true>(context);
		context.registers.cx() = pop<uint16_t, true>(context);
		context.registers.ax() = pop<uint16_t, true>(context);
	}
}